

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

char * stbds_stralloc(stbds_string_arena *a,char *str)

{
  size_t sVar1;
  ulong __n;
  ulong uVar2;
  stbds_string_block *psVar3;
  char *__dest;
  stbds_string_block *sb_1;
  stbds_string_block *sb;
  size_t blocksize;
  size_t len;
  char *p;
  char *str_local;
  stbds_string_arena *a_local;
  
  sVar1 = strlen(str);
  __n = sVar1 + 1;
  if (a->remaining < __n) {
    uVar2 = 0x200L << (a->block >> 1 & 0x3f);
    if (uVar2 < 0x100000) {
      a->block = a->block + '\x01';
    }
    if (uVar2 < __n) {
      psVar3 = (stbds_string_block *)realloc((void *)0x0,sVar1 + 9);
      memmove(psVar3->storage,str,__n);
      if (a->storage == (stbds_string_block *)0x0) {
        psVar3->next = (stbds_string_block *)0x0;
        a->storage = psVar3;
        a->remaining = 0;
      }
      else {
        psVar3->next = a->storage->next;
        a->storage->next = psVar3;
      }
      return psVar3->storage;
    }
    psVar3 = (stbds_string_block *)realloc((void *)0x0,uVar2 + 8);
    psVar3->next = a->storage;
    a->storage = psVar3;
    a->remaining = uVar2;
  }
  __dest = (char *)((long)a->storage + ((a->remaining + 8) - __n));
  a->remaining = a->remaining - __n;
  memmove(__dest,str,__n);
  return __dest;
}

Assistant:

char *stbds_stralloc(stbds_string_arena *a, char *str)
{
  char *p;
  size_t len = strlen(str)+1;
  if (len > a->remaining) {
    // compute the next blocksize
    size_t blocksize = a->block;

    // size is 512, 512, 1024, 1024, 2048, 2048, 4096, 4096, etc., so that
    // there are log(SIZE) allocations to free when we destroy the table
    blocksize = (size_t) (STBDS_STRING_ARENA_BLOCKSIZE_MIN) << (blocksize>>1);

    // if size is under 1M, advance to next blocktype
    if (blocksize < (size_t)(STBDS_STRING_ARENA_BLOCKSIZE_MAX))
      ++a->block;

    if (len > blocksize) {
      // if string is larger than blocksize, then just allocate the full size.
      // note that we still advance string_block so block size will continue
      // increasing, so e.g. if somebody only calls this with 1000-long strings,
      // eventually the arena will start doubling and handling those as well
      stbds_string_block *sb = (stbds_string_block *) STBDS_REALLOC(NULL, 0, sizeof(*sb)-8 + len);
      memmove(sb->storage, str, len);
      if (a->storage) {
        // insert it after the first element, so that we don't waste the space there
        sb->next = a->storage->next;
        a->storage->next = sb;
      } else {
        sb->next = 0;
        a->storage = sb;
        a->remaining = 0; // this is redundant, but good for clarity
      }
      return sb->storage;
    } else {
      stbds_string_block *sb = (stbds_string_block *) STBDS_REALLOC(NULL, 0, sizeof(*sb)-8 + blocksize);
      sb->next = a->storage;
      a->storage = sb;
      a->remaining = blocksize;
    }
  }

  STBDS_ASSERT(len <= a->remaining);
  p = a->storage->storage + a->remaining - len;
  a->remaining -= len;
  memmove(p, str, len);
  return p;
}